

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# incbet.c
# Opt level: O1

double hcephes_pseries(double a,double b,double x)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar6 = (1.0 - b) * x;
  dVar1 = dVar6 / (a + 1.0);
  dVar2 = (1.0 / a) * 1.1102230246251565e-16;
  dVar3 = 0.0;
  if (dVar2 < ABS(dVar1)) {
    dVar4 = 2.0;
    do {
      dVar6 = dVar6 * (((dVar4 - b) * x) / dVar4);
      dVar5 = dVar6 / (dVar4 + a);
      dVar3 = dVar3 + dVar5;
      dVar4 = dVar4 + 1.0;
    } while (dVar2 < ABS(dVar5));
  }
  dVar3 = 1.0 / a + dVar1 + dVar3;
  dVar1 = log(x);
  dVar2 = a + b;
  if ((171.6243769563027 <= dVar2) || (709.782712893384 <= ABS(dVar1 * a))) {
    dVar2 = hcephes_lgam(dVar2);
    dVar6 = hcephes_lgam(a);
    dVar4 = hcephes_lgam(b);
    dVar3 = log(dVar3);
    dVar3 = dVar3 + dVar1 * a + ((dVar2 - dVar6) - dVar4);
    dVar1 = 0.0;
    if (-745.1332191019412 <= dVar3) {
      dVar1 = exp(dVar3);
      return dVar1;
    }
  }
  else {
    dVar2 = hcephes_gamma(dVar2);
    dVar6 = hcephes_gamma(a);
    dVar4 = hcephes_gamma(b);
    dVar1 = pow(x,a);
    dVar1 = dVar1 * dVar3 * (dVar2 / (dVar4 * dVar6));
  }
  return dVar1;
}

Assistant:

static double hcephes_pseries(double a, double b, double x) {
    double s, t, u, v, n, t1, z, ai;

    ai = 1.0 / a;
    u = (1.0 - b) * x;
    v = u / (a + 1.0);
    t1 = v;
    t = u;
    n = 2.0;
    s = 0.0;
    z = HCEPHES_MACHEP * ai;
    while (fabs(v) > z) {
        u = (n - b) * x / n;
        t *= u;
        v = t / (a + n);
        s += v;
        n += 1.0;
    }
    s += t1;
    s += ai;

    u = a * log(x);
    if ((a + b) < MAXGAM && fabs(u) < HCEPHES_MAXLOG) {
        t = hcephes_gamma(a + b) / (hcephes_gamma(a) * hcephes_gamma(b));
        s = s * t * pow(x, a);
    } else {
        t = hcephes_lgam(a + b) - hcephes_lgam(a) - hcephes_lgam(b) + u + log(s);
        if (t < HCEPHES_MINLOG)
            s = 0.0;
        else
            s = exp(t);
    }
    return (s);
}